

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O0

void __thiscall OSSLEVPSymmetricAlgorithm::clean(OSSLEVPSymmetricAlgorithm *this)

{
  long in_RDI;
  
  EVP_CIPHER_CTX_free(*(EVP_CIPHER_CTX **)(in_RDI + 0x60));
  *(undefined8 *)(in_RDI + 0x60) = 0;
  BN_free(*(BIGNUM **)(in_RDI + 0x68));
  *(undefined8 *)(in_RDI + 0x68) = 0;
  BN_free(*(BIGNUM **)(in_RDI + 0x70));
  *(undefined8 *)(in_RDI + 0x70) = 0;
  return;
}

Assistant:

void OSSLEVPSymmetricAlgorithm::clean()
{
		EVP_CIPHER_CTX_free(pCurCTX);
		pCurCTX = NULL;
		BN_free(maximumBytes);
		maximumBytes = NULL;
		BN_free(counterBytes);
		counterBytes = NULL;
}